

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_info.hpp
# Opt level: O3

void __thiscall duckdb::AlterEntryData::~AlterEntryData(AlterEntryData *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->schema)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->schema).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->catalog)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->catalog).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

AlterEntryData(string catalog_p, string schema_p, string name_p, OnEntryNotFound if_not_found)
	    : catalog(std::move(catalog_p)), schema(std::move(schema_p)), name(std::move(name_p)),
	      if_not_found(if_not_found) {
	}